

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocaleData::signPrefix(QLocaleData *this,bool negative,uint flags)

{
  char16_t *str;
  uint in_ECX;
  byte in_DL;
  QLocaleData *in_RDI;
  long in_FS_OFFSET;
  size_t RuntimeThreshold;
  size_t i;
  QStringView *this_00;
  QLocaleData *pQVar1;
  ulong local_30;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_DL & 1) == 0) {
    if ((in_ECX & 0x10) == 0) {
      if ((in_ECX & 8) == 0) {
        QString::QString((QString *)0x13e25e);
      }
      else {
        this_00 = &local_18;
        pQVar1 = in_RDI;
        str = std::data<char16_t_const,2ul>((char16_t (*) [2])L" ");
        for (local_30 = 0; (local_30 < 2 && (L" "[local_30] != L'\0')); local_30 = local_30 + 1) {
        }
        QStringView::QStringView<char16_t,_true>((QStringView *)in_RDI,str,(qsizetype)this_00);
        QStringView::toString(this_00);
        in_RDI = pQVar1;
      }
    }
    else {
      positiveSign(in_RDI);
    }
  }
  else {
    negativeSign(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString QLocaleData::signPrefix(bool negative, unsigned flags) const
{
    if (negative)
        return negativeSign();
    if (flags & AlwaysShowSign)
        return positiveSign();
    if (flags & BlankBeforePositive)
        return QStringView(u" ").toString();
    return {};
}